

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,char *label,ImGuiID tab_id,
               ImGuiID close_button_id)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiID IVar4;
  ImGuiItemStatusFlags IVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  int iVar8;
  ImU32 col;
  undefined7 extraout_var;
  char *pcVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  char *label_end;
  ImVec2 local_b8;
  ImVec2 local_b0;
  float local_a8;
  float fStack_a4;
  ulong local_98;
  ImDrawList *local_90;
  ImVec2 label_size;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImVec2 local_48;
  ImVec2 IStack_40;
  ImVec2 local_38;
  
  pIVar6 = GImGui;
  local_a8 = (float)tab_id;
  local_90 = draw_list;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar12 = (bb->Min).x;
  local_b0.x = (bb->Max).x;
  local_98._0_1_ = 0;
  if (1.0 < local_b0.x - fVar12) {
    local_b0.y = (bb->Max).y;
    IVar1 = (pIVar6->Style).FramePadding;
    fVar11 = IVar1.x;
    local_b0.x = local_b0.x - fVar11;
    local_b8.y = (bb->Min).y + IVar1.y;
    local_b8.x = fVar12 + fVar11;
    if ((flags & 1U) != 0) {
      IVar1 = CalcTextSize("*",(char *)0x0,false,-1.0);
      local_b0.x = local_b0.x - IVar1.x;
      IVar1 = (pIVar6->Style).FramePadding;
      fVar11 = IVar1.x;
      fVar12 = (bb->Min).x + fVar11 + label_size.x + 2.0;
      if (local_b0.x <= fVar12) {
        fVar12 = local_b0.x;
      }
      label_end = (char *)CONCAT44((float)(int)(pIVar6->FontSize * -0.25) +
                                   (bb->Min).y + (pIVar6->Style).FramePadding.y,fVar12);
      local_60.y = (bb->Max).y - IVar1.y;
      local_60.x = (bb->Max).x - fVar11;
      local_38.x = 0.0;
      local_38.y = 0.0;
      RenderTextClippedEx(local_90,(ImVec2 *)&label_end,&local_60,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_38,(ImRect *)0x0);
    }
    local_98 = CONCAT44(local_98._4_4_,flags);
    if ((close_button_id == 0) ||
       ((pIVar6->HoveredId != close_button_id && (float)pIVar6->HoveredId != local_a8 &&
        (pIVar6->ActiveId != close_button_id)))) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    fVar12 = local_b8.x;
    local_a8 = local_b0.x;
    if (bVar3) {
      pIVar2 = GImGui->CurrentWindow;
      fVar11 = pIVar6->FontSize * 0.5;
      label_end = (char *)CONCAT44((bb->Min).y + (pIVar6->Style).FramePadding.y + fVar11,
                                   ((bb->Max).x - (pIVar6->Style).FramePadding.x) - fVar11);
      local_48 = (pIVar2->DC).LastItemRect.Min;
      IStack_40 = (pIVar2->DC).LastItemRect.Max;
      local_58 = (pIVar2->DC).LastItemDisplayRect.Min;
      IStack_50 = (pIVar2->DC).LastItemDisplayRect.Max;
      IVar4 = (pIVar2->DC).LastItemId;
      IVar5 = (pIVar2->DC).LastItemStatusFlags;
      bVar7 = CloseButton(close_button_id,(ImVec2 *)&label_end,fVar11);
      uVar10 = CONCAT71(extraout_var,bVar7) & 0xffffffff;
      pIVar2 = GImGui->CurrentWindow;
      (pIVar2->DC).LastItemId = IVar4;
      (pIVar2->DC).LastItemStatusFlags = IVar5;
      (pIVar2->DC).LastItemRect.Min = local_48;
      (pIVar2->DC).LastItemRect.Max = IStack_40;
      (pIVar2->DC).LastItemDisplayRect.Min = local_58;
      (pIVar2->DC).LastItemDisplayRect.Max = IStack_50;
      if ((local_98 & 4) == 0) {
        bVar7 = IsMouseClicked(2,false);
        uVar10 = CONCAT71((int7)(uVar10 >> 8),(byte)uVar10 | bVar7);
      }
      local_b0.x = local_b0.x - (fVar11 + fVar11);
      local_98 = uVar10;
    }
    else {
      local_98 = 0;
    }
    pcVar9 = FindRenderedTextEnd(label,(char *)0x0);
    if (label_size.x <= local_a8 - fVar12) {
      label_end = (char *)0x0;
      RenderTextClippedEx(local_90,&local_b8,&local_b0,label,pcVar9,&label_size,(ImVec2 *)&label_end
                          ,(ImRect *)0x0);
    }
    else {
      label_end = (char *)0x0;
      IVar1 = ImFont::CalcTextSizeA
                        (pIVar6->Font,pIVar6->FontSize,(local_a8 - fVar12) + -5.0 + 1.0,0.0,label,
                         pcVar9,&label_end);
      fVar12 = IVar1.x;
      fStack_a4 = IVar1.y;
      if (label_end < pcVar9 && label_end == label) {
        iVar8 = ImTextCountUtf8BytesFromChar(label,pcVar9);
        label_end = label + iVar8;
        IVar1 = ImFont::CalcTextSizeA
                          (pIVar6->Font,pIVar6->FontSize,3.4028235e+38,0.0,label,label_end,
                           (char **)0x0);
        fVar12 = IVar1.x;
        fStack_a4 = IVar1.y;
      }
      local_a8 = fVar12;
      pcVar9 = label_end;
      while ((label < pcVar9 && ((pcVar9[-1] == ' ' || (pcVar9[-1] == '\t'))))) {
        label_end = pcVar9 + -1;
        IVar1 = ImFont::CalcTextSizeA
                          (pIVar6->Font,pIVar6->FontSize,3.4028235e+38,0.0,label_end,pcVar9,
                           (char **)0x0);
        local_a8 = local_a8 - IVar1.x;
        pcVar9 = label_end;
      }
      local_60.x = 0.0;
      local_60.y = 0.0;
      label_end = pcVar9;
      RenderTextClippedEx(local_90,&local_b8,&local_b0,label,pcVar9,&label_size,&local_60,
                          (ImRect *)0x0);
      if (!bVar3) {
        local_a8 = local_a8 + local_b8.x + 1.0;
        if (local_a8 + 5.0 <= (bb->Max).x) {
          fVar12 = local_b8.y;
          col = GetColorU32(0,1.0);
          IVar1.y = fVar12;
          IVar1.x = local_a8;
          RenderPixelEllipsis(local_90,IVar1,3,col);
        }
      }
    }
  }
  return (bool)(undefined1)local_98;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + style.FramePadding.x, bb.Min.y + style.FramePadding.y, bb.Max.x - style.FramePadding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + style.FramePadding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + style.FramePadding.y + (float)(int)(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - style.FramePadding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize * 0.5f;
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - style.FramePadding.x - close_button_sz, bb.Min.y + style.FramePadding.y + close_button_sz), close_button_sz))
            close_button_pressed = true;
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz * 2.0f;
    }

    // Label with ellipsis
    // FIXME: This should be extracted into a helper but the use of text_pixel_clip_bb and !close_button_visible makes it tricky to abstract at the moment
    const char* label_display_end = FindRenderedTextEnd(label);
    if (label_size.x > text_ellipsis_clip_bb.GetWidth())
    {
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* label_end = NULL;
        float label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, text_ellipsis_clip_bb.GetWidth() - ellipsis_width + 1.0f, 0.0f, label, label_display_end, &label_end).x;
        if (label_end == label && label_end < label_display_end)    // Always display at least 1 character if there's no room for character + ellipsis
        {
            label_end = label + ImTextCountUtf8BytesFromChar(label, label_display_end);
            label_size_clipped_x = g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label, label_end).x;
        }
        while (label_end > label && ImCharIsBlankA(label_end[-1])) // Trim trailing space
        {
            label_end--;
            label_size_clipped_x -= g.Font->CalcTextSizeA(g.FontSize, FLT_MAX, 0.0f, label_end, label_end + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_end, &label_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = text_pixel_clip_bb.Min.x + label_size_clipped_x + 1.0f;
        if (!close_button_visible && ellipsis_x + ellipsis_width <= bb.Max.x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, text_pixel_clip_bb.Min.y), ellipsis_dot_count, GetColorU32(ImGuiCol_Text));
    }
    else
    {
        RenderTextClippedEx(draw_list, text_pixel_clip_bb.Min, text_pixel_clip_bb.Max, label, label_display_end, &label_size, ImVec2(0.0f, 0.0f));
    }

    return close_button_pressed;
}